

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O3

void duckdb::alp::AlpCompression<float,_true>::Compress
               (float *input_vector,idx_t n_values,uint16_t *vector_null_positions,idx_t nulls_count
               ,State *state)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  int64_t iVar5;
  unsigned_long uVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  ushort uVar12;
  uint64_t uVar13;
  idx_t iVar14;
  float fVar15;
  long local_38;
  
  if ((ulong)(((long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2) {
    pvVar4 = vector<duckdb::alp::AlpCombination,_true>::operator[](&state->best_k_combinations,0);
    state->vector_encoding_indices = pvVar4->encoding_indices;
  }
  else {
    FindBestFactorAndExponent(input_vector,n_values,state);
  }
  uVar10 = 0x7fffffffffffffff;
  if (n_values == 0) {
    iVar5 = 0;
  }
  else {
    uVar12 = 0;
    local_38 = 0x7ffffffffffffc00;
    iVar14 = 0;
    do {
      fVar1 = input_vector[iVar14];
      fVar15 = *(float *)(AlpTypedConstants<float>::EXP_ARR +
                         (ulong)((ushort)state->vector_encoding_indices & 0xff) * 4) * fVar1 *
               *(float *)(AlpTypedConstants<float>::FRAC_ARR +
                         (ulong)((ushort)state->vector_encoding_indices >> 8) * 4);
      bVar3 = IsImpossibleToEncode(fVar15);
      lVar8 = (long)(fVar15 + 12582912.0 + -12582912.0);
      if (bVar3) {
        lVar8 = local_38;
      }
      lVar2 = *(long *)(AlpConstants::FACT_ARR +
                       (ulong)((ushort)state->vector_encoding_indices >> 8) * 8);
      fVar15 = *(float *)(AlpTypedConstants<float>::FRAC_ARR +
                         (ulong)((ushort)state->vector_encoding_indices & 0xff) * 4);
      state->encoded_integers[iVar14] = lVar8;
      uVar9 = (ulong)uVar12;
      uVar12 = uVar12 + ((float)lVar2 * (float)lVar8 * fVar15 != fVar1);
      state->exceptions_positions[uVar9] = (uint16_t)iVar14;
      iVar14 = iVar14 + 1;
    } while (n_values != iVar14);
    iVar5 = 0;
    uVar9 = 0;
    do {
      if (uVar9 != state->exceptions_positions[uVar9]) {
        iVar5 = state->encoded_integers[uVar9];
        break;
      }
      uVar9 = uVar9 + 1;
    } while (n_values != uVar9);
    if (uVar12 != 0) {
      uVar9 = 0;
      do {
        fVar1 = input_vector[state->exceptions_positions[uVar9]];
        state->encoded_integers[state->exceptions_positions[uVar9]] = iVar5;
        state->exceptions[uVar9] = fVar1;
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
      goto LAB_016ebd1a;
    }
  }
  uVar12 = 0;
LAB_016ebd1a:
  state->exceptions_count = uVar12;
  if (nulls_count != 0) {
    iVar14 = 0;
    do {
      state->encoded_integers[vector_null_positions[iVar14]] = iVar5;
      iVar14 = iVar14 + 1;
    } while (nulls_count != iVar14);
  }
  uVar13 = 0x8000000000000000;
  if (n_values == 0) {
    n_values = 0;
  }
  else {
    iVar14 = 0;
    uVar11 = uVar10;
    do {
      uVar10 = state->encoded_integers[iVar14];
      if ((long)uVar13 <= (long)uVar10) {
        uVar13 = uVar10;
      }
      if ((long)uVar11 < (long)uVar10) {
        uVar10 = uVar11;
      }
      iVar14 = iVar14 + 1;
      uVar11 = uVar10;
    } while (n_values != iVar14);
    if ((n_values & 0x1f) != 0) {
      uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)n_values & 0x1f);
      n_values = (n_values - uVar6) + 0x20;
    }
  }
  uVar9 = uVar13 - uVar10;
  lVar8 = 0x3f;
  if (uVar9 != 0) {
    for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
    }
  }
  bVar7 = 0x40;
  if (uVar9 >> 0x38 == 0) {
    bVar7 = 0x40 - ((byte)lVar8 ^ 0x3f);
  }
  if (uVar13 == uVar10) {
    bVar7 = 0;
  }
  state->bit_width = (ushort)bVar7;
  state->bp_size = bVar7 * n_values >> 3;
  state->frame_of_reference = uVar10;
  return;
}

Assistant:

static void Compress(const T *input_vector, idx_t n_values, const uint16_t *vector_null_positions,
	                     idx_t nulls_count, State &state) {
		if (state.best_k_combinations.size() > 1) {
			FindBestFactorAndExponent(input_vector, n_values, state);
		} else {
			state.vector_encoding_indices = state.best_k_combinations[0].encoding_indices;
		}

		// Encoding Floating-Point to Int64
		//! We encode all the values regardless of their correctness to recover the original floating-point
		uint16_t exceptions_idx = 0;
		for (idx_t i = 0; i < n_values; i++) {
			T actual_value = input_vector[i];
			int64_t encoded_value = EncodeValue(actual_value, state.vector_encoding_indices);
			T decoded_value = DecodeValue(encoded_value, state.vector_encoding_indices);
			state.encoded_integers[i] = encoded_value;
			//! We detect exceptions using a predicated comparison
			auto is_exception = (decoded_value != actual_value);
			state.exceptions_positions[exceptions_idx] = UnsafeNumericCast<uint16_t>(i);
			exceptions_idx += is_exception;
		}

		// Finding first non exception value
		int64_t a_non_exception_value = 0;
		for (idx_t i = 0; i < n_values; i++) {
			if (i != state.exceptions_positions[i]) {
				a_non_exception_value = state.encoded_integers[i];
				break;
			}
		}
		// Replacing that first non exception value on the vector exceptions
		for (idx_t i = 0; i < exceptions_idx; i++) {
			idx_t exception_pos = state.exceptions_positions[i];
			T actual_value = input_vector[exception_pos];
			state.encoded_integers[exception_pos] = a_non_exception_value;
			state.exceptions[i] = actual_value;
		}
		state.exceptions_count = exceptions_idx;

		// Replacing nulls with that first non exception value
		for (idx_t i = 0; i < nulls_count; i++) {
			uint16_t null_value_pos = vector_null_positions[i];
			state.encoded_integers[null_value_pos] = a_non_exception_value;
		}

		// Analyze FFOR
		auto min_value = NumericLimits<int64_t>::Maximum();
		auto max_value = NumericLimits<int64_t>::Minimum();
		for (idx_t i = 0; i < n_values; i++) {
			max_value = MaxValue(max_value, state.encoded_integers[i]);
			min_value = MinValue(min_value, state.encoded_integers[i]);
		}
		uint64_t min_max_diff = (static_cast<uint64_t>(max_value) - static_cast<uint64_t>(min_value));

		auto *u_encoded_integers = reinterpret_cast<uint64_t *>(state.encoded_integers);
		auto const u_min_value = static_cast<uint64_t>(min_value);

		// Subtract FOR
		if (!EMPTY) { //! We only execute the FOR if we are writing the data
			for (idx_t i = 0; i < n_values; i++) {
				u_encoded_integers[i] -= u_min_value;
			}
		}

		auto bit_width = BitpackingPrimitives::MinimumBitWidth<uint64_t, false>(min_max_diff);
		auto bp_size = BitpackingPrimitives::GetRequiredSize(n_values, bit_width);
		if (!EMPTY && bit_width > 0) { //! We only execute the BP if we are writing the data
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.values_encoded, u_encoded_integers, n_values,
			                                                  bit_width);
		}
		state.bit_width = bit_width;                                 // in bits
		state.bp_size = bp_size;                                     // in bytes
		state.frame_of_reference = static_cast<uint64_t>(min_value); // understood this can be negative
	}